

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
          (ArenaStringPtr *this,string *initial_value)

{
  pointer pcVar1;
  LogMessage *other;
  string *psVar2;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (initial_value == (string *)0x0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/arenastring.h"
               ,0x179);
    other = LogMessage::operator<<(&local_60,"CHECK failed: initial_value != NULL: ");
    LogFinisher::operator=(&local_21,other);
    LogMessage::~LogMessage(&local_60);
  }
  psVar2 = (string *)operator_new(0x20);
  (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
  pcVar1 = (initial_value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar2,pcVar1,pcVar1 + initial_value->_M_string_length);
  this->ptr_ = psVar2;
  return;
}

Assistant:

PROTOBUF_NOINLINE
  void CreateInstanceNoArena(const ::std::string* initial_value) {
    GOOGLE_DCHECK(initial_value != NULL);
    ptr_ = new ::std::string(*initial_value);
  }